

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O2

void dump_CSTK(int before)

{
  LispPTR LVar1;
  DLword *pDVar2;
  DLword *NAddr;
  
  pDVar2 = MachineState.csp + -(long)before;
  for (NAddr = pDVar2; NAddr != MachineState.csp; NAddr = NAddr + 1) {
    LVar1 = LAddrFromNative(NAddr);
    printf("\n%x : %x ",(ulong)LVar1,(ulong)*(ushort *)((ulong)pDVar2 ^ 2));
    pDVar2 = pDVar2 + 1;
  }
  LVar1 = LAddrFromNative(MachineState.csp);
  printf("\nCurrentSTKP : %x  ",(ulong)LVar1);
  printf("\ncontents :  %x ",(ulong)*(uint *)(MachineState.csp + -1));
  return;
}

Assistant:

void dump_CSTK(int before) {
  DLword *ptr;
  ptr = CurrentStackPTR - before;
  while (ptr != CurrentStackPTR) {
    printf("\n%x : %x ", LAddrFromNative(ptr), GETWORD(ptr));
    ptr++;
  }
  printf("\nCurrentSTKP : %x  ", LAddrFromNative(CurrentStackPTR));
  printf("\ncontents :  %x ", *((LispPTR *)(CurrentStackPTR - 1)));
}